

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

JavascriptFunction * __thiscall
Js::JavascriptLibrary::EnsureArrayPrototypeValuesFunction(JavascriptLibrary *this)

{
  Type *addr;
  bool bVar1;
  RuntimeFunction *pRVar2;
  
  addr = &this->arrayPrototypeValuesFunction;
  if ((this->arrayPrototypeValuesFunction).ptr == (JavascriptFunction *)0x0) {
    bVar1 = ScriptContext::IsJsBuiltInEnabled((this->super_JavascriptLibraryBase).scriptContext.ptr)
    ;
    if (bVar1) {
      EnsureBuiltInEngineIsReady
                (Array_prototype,(this->super_JavascriptLibraryBase).scriptContext.ptr);
    }
    else {
      pRVar2 = DefaultCreateFunction
                         (this,(FunctionInfo *)JavascriptArray::EntryInfo::Values,0,
                          (DynamicObject *)0x0,(DynamicType *)0x0,399);
      Memory::Recycler::WBSetBit((char *)addr);
      (this->arrayPrototypeValuesFunction).ptr = &pRVar2->super_JavascriptFunction;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    }
  }
  return addr->ptr;
}

Assistant:

JavascriptFunction* JavascriptLibrary::EnsureArrayPrototypeValuesFunction()
    {
        if (arrayPrototypeValuesFunction == nullptr)
        {
#ifndef ENABLE_JS_BUILTINS
            arrayPrototypeValuesFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Values, 0, nullptr, nullptr, PropertyIds::values);
#else
            if (!scriptContext->IsJsBuiltInEnabled())
            {
                arrayPrototypeValuesFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Values, 0, nullptr, nullptr, PropertyIds::values);
            }
            else
            {
                EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
            }
#endif
        }
        return arrayPrototypeValuesFunction;
    }